

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::UnnestBind(duckdb *this,ClientContext *context,TableFunctionBindInput *input,
                  vector<duckdb::LogicalType,_true> *return_types,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *names)

{
  vector<duckdb::LogicalType,_true> *this_00;
  reference pvVar1;
  LogicalType *__x;
  undefined8 *puVar2;
  BinderException *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  this_00 = input->input_table_types;
  if ((long)(this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start == 0x18) {
    pvVar1 = vector<duckdb::LogicalType,_true>::operator[](this_00,0);
    if (pvVar1->id_ == LIST) {
      pvVar1 = vector<duckdb::LogicalType,_true>::operator[](input->input_table_types,0);
      __x = ListType::GetChildType(pvVar1);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&return_types->
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"unnest","");
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
                 &local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      pvVar1 = vector<duckdb::LogicalType,_true>::operator[](input->input_table_types,0);
      puVar2 = (undefined8 *)operator_new(0x20);
      LogicalType::LogicalType((LogicalType *)&local_48,pvVar1);
      *puVar2 = &PTR__UnnestBindData_024955c0;
      LogicalType::LogicalType((LogicalType *)(puVar2 + 1),(LogicalType *)&local_48);
      LogicalType::~LogicalType((LogicalType *)&local_48);
      *(undefined8 **)this = puVar2;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"UNNEST requires a single list as input","");
  BinderException::BinderException(this_01,&local_48);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static unique_ptr<FunctionData> UnnestBind(ClientContext &context, TableFunctionBindInput &input,
                                           vector<LogicalType> &return_types, vector<string> &names) {
	if (input.input_table_types.size() != 1 || input.input_table_types[0].id() != LogicalTypeId::LIST) {
		throw BinderException("UNNEST requires a single list as input");
	}
	return_types.push_back(ListType::GetChildType(input.input_table_types[0]));
	names.push_back("unnest");
	return make_uniq<UnnestBindData>(input.input_table_types[0]);
}